

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O2

int run_test_tcp_bind_or_listen_error_after_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr local_f0;
  uv_tcp_t tcp;
  
  local_f0.sa_data[10] = '\0';
  local_f0.sa_data[0xb] = '\0';
  local_f0.sa_data[0xc] = '\0';
  local_f0.sa_data[0xd] = '\0';
  local_f0.sa_data[2] = '\0';
  local_f0.sa_data[3] = '\0';
  local_f0.sa_data[4] = '\0';
  local_f0.sa_data[5] = '\0';
  local_f0.sa_data[6] = '\0';
  local_f0.sa_data[7] = '\0';
  local_f0.sa_data[8] = '\0';
  local_f0.sa_data[9] = '\0';
  local_f0.sa_family = 2;
  local_f0.sa_data[0] = '\'';
  local_f0.sa_data[1] = '\x0f';
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&tcp);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uv_close((uv_handle_t *)&tcp,(uv_close_cb)0x0);
    iVar1 = uv_tcp_bind(&tcp,&local_f0,0);
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a == -0x16) {
      iVar1 = uv_listen((uv_stream_t *)&tcp,5,(uv_connection_cb)0x0);
      eval_a = (int64_t)iVar1;
      eval_b = -0x16;
      if (eval_a == -0x16) {
        puVar2 = uv_default_loop();
        iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          puVar2 = uv_default_loop();
          close_loop(puVar2);
          eval_a = 0;
          puVar2 = uv_default_loop();
          iVar1 = uv_loop_close(puVar2);
          eval_b = (int64_t)iVar1;
          if (eval_b == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar5 = "uv_loop_close(uv_default_loop())";
          pcVar4 = "0";
          uVar3 = 0x13b;
        }
        else {
          pcVar5 = "0";
          pcVar4 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
          uVar3 = 0x13a;
        }
      }
      else {
        pcVar5 = "UV_EINVAL";
        pcVar4 = "uv_listen((uv_stream_t*) &tcp, 5, ((void*)0))";
        uVar3 = 0x139;
      }
    }
    else {
      pcVar5 = "UV_EINVAL";
      pcVar4 = "uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0)";
      uVar3 = 0x138;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_tcp_init(uv_default_loop(), &tcp)";
    uVar3 = 0x136;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind_or_listen_error_after_close) {
  uv_tcp_t tcp;
  struct sockaddr_in addr;

  memset(&addr, 0, sizeof(addr));
  addr.sin_addr.s_addr = htonl(INADDR_ANY);
  addr.sin_port = htons(9999);
  addr.sin_family = AF_INET;

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &tcp));
  uv_close((uv_handle_t*) &tcp, NULL);
  ASSERT_EQ(uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0), UV_EINVAL);
  ASSERT_EQ(uv_listen((uv_stream_t*) &tcp, 5, NULL), UV_EINVAL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}